

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall kj::_::Coroutine<bool>::fulfill(Coroutine<bool> *this,FixVoid<bool> *value)

{
  bool bVar1;
  bool *value_00;
  ExceptionOr<bool> local_1b8;
  bool *local_18;
  FixVoid<bool> *value_local;
  Coroutine<bool> *this_local;
  
  local_18 = value;
  value_local = (FixVoid<bool> *)this;
  bVar1 = CoroutineBase::isWaiting(&this->super_CoroutineBase);
  if (bVar1) {
    value_00 = mv<bool>(local_18);
    ExceptionOr<bool>::ExceptionOr(&local_1b8,value_00);
    ExceptionOr<bool>::operator=(&this->result,&local_1b8);
    ExceptionOr<bool>::~ExceptionOr(&local_1b8);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }